

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O1

void ncnn::draw_text_c2(uchar *pixels,int w,int h,int stride,char *text,int x,int y,
                       int fontpixelsize,uint color)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uchar *resized_font_bitmap;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  uchar *puVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uchar *puVar14;
  long lVar15;
  
  resized_font_bitmap = (uchar *)operator_new__((ulong)(uint)(fontpixelsize * fontpixelsize * 2));
  sVar7 = strlen(text);
  if (0 < (int)(uint)sVar7) {
    uVar9 = 0;
    uVar6 = x;
    do {
      cVar1 = text[uVar9];
      if (cVar1 == ' ') {
        uVar5 = uVar6 + fontpixelsize;
      }
      else if (cVar1 == '\n') {
        y = y + fontpixelsize * 2;
        uVar5 = x;
      }
      else {
        iVar4 = isprint((int)cVar1);
        uVar5 = uVar6;
        if (iVar4 != 0) {
          resize_bilinear_font
                    ((uchar *)((long)cVar1 * 400 + 0x5f34c0),resized_font_bitmap,fontpixelsize);
          uVar11 = 0;
          if (0 < y) {
            uVar11 = y;
          }
          uVar13 = y + fontpixelsize * 2;
          if (h <= (int)uVar13) {
            uVar13 = h;
          }
          uVar8 = 0;
          if (0 < (int)uVar6) {
            uVar8 = uVar6;
          }
          uVar5 = uVar6 + fontpixelsize;
          uVar3 = w;
          if ((int)uVar5 < w) {
            uVar3 = uVar5;
          }
          if ((int)uVar11 < (int)uVar13) {
            uVar12 = (ulong)uVar11;
            puVar10 = pixels + (long)stride * uVar12 + (ulong)(uVar8 * 2);
            puVar14 = resized_font_bitmap +
                      (((uVar12 - (long)y) * (long)fontpixelsize + (ulong)uVar8) - (long)(int)uVar6)
            ;
            do {
              if ((int)uVar8 < (int)uVar3) {
                lVar15 = 0;
                do {
                  bVar2 = puVar14[lVar15];
                  uVar6 = bVar2 ^ 0xff;
                  puVar10[lVar15 * 2] =
                       (uchar)((ulong)((color & 0xff) * (uint)bVar2 + puVar10[lVar15 * 2] * uVar6) *
                               0x1010102 >> 0x20);
                  puVar10[lVar15 * 2 + 1] =
                       (uchar)((ulong)((uint)bVar2 * (color >> 8 & 0xff) +
                                      puVar10[lVar15 * 2 + 1] * uVar6) * 0x1010102 >> 0x20);
                  lVar15 = lVar15 + 1;
                } while (uVar3 - uVar8 != (int)lVar15);
              }
              uVar12 = uVar12 + 1;
              puVar10 = puVar10 + stride;
              puVar14 = puVar14 + fontpixelsize;
            } while (uVar12 != uVar13);
          }
        }
      }
      uVar6 = uVar5;
      uVar9 = uVar9 + 1;
    } while (uVar9 != ((uint)sVar7 & 0x7fffffff));
  }
  operator_delete__(resized_font_bitmap);
  return;
}

Assistant:

void draw_text_c2(unsigned char* pixels, int w, int h, int stride, const char* text, int x, int y, int fontpixelsize, unsigned int color)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned char* resized_font_bitmap = new unsigned char[fontpixelsize * fontpixelsize * 2];

    const int n = strlen(text);

    int cursor_x = x;
    int cursor_y = y;
    for (int i = 0; i < n; i++)
    {
        char ch = text[i];

        if (ch == '\n')
        {
            // newline
            cursor_x = x;
            cursor_y += fontpixelsize * 2;
            continue;
        }

        if (ch == ' ')
        {
            cursor_x += fontpixelsize;
            continue;
        }

        if (isprint(ch) != 0)
        {
            const unsigned char* font_bitmap = mono_font_data[ch - '!'];

            // draw resized character
            resize_bilinear_font(font_bitmap, resized_font_bitmap, fontpixelsize);

            const int ystart = std::max(cursor_y, 0);
            const int yend = std::min(cursor_y + fontpixelsize * 2, h);
            const int xstart = std::max(cursor_x, 0);
            const int xend = std::min(cursor_x + fontpixelsize, w);

            for (int j = ystart; j < yend; j++)
            {
                const unsigned char* palpha = resized_font_bitmap + (j - cursor_y) * fontpixelsize + xstart - cursor_x;
                unsigned char* p = pixels + stride * j + xstart * 2;

                for (int k = xstart; k < xend; k++)
                {
                    unsigned char alpha = *palpha++;

                    p[0] = (p[0] * (255 - alpha) + pen_color[0] * alpha) / 255;
                    p[1] = (p[1] * (255 - alpha) + pen_color[1] * alpha) / 255;
                    p += 2;
                }
            }

            cursor_x += fontpixelsize;
        }
    }

    delete[] resized_font_bitmap;
}